

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
webots_velocity_message_write_read::test_method(webots_velocity_message_write_read *this)

{
  size_t i;
  long lVar1;
  buffer buffer;
  buffer_writer writer;
  webots_velocity_message read_msg;
  buffer_reader reader;
  assertion_result local_110;
  buffer local_f8;
  double local_d8 [2];
  char *local_c8;
  char *local_c0;
  buffer_writer local_b8;
  binary_expr<boost::test_tools::assertion::value_expr<double_&>,_double_&,_boost::test_tools::assertion::op::EQ<double,_double,_void>_>
  local_a8;
  webots_velocity_message local_98;
  lazy_ostream local_88;
  undefined1 *local_78;
  char **local_70;
  buffer_reader local_68;
  const_string local_50;
  const_string local_40;
  
  local_d8[0] = 4.1;
  local_d8[1] = 2.5;
  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buffer_writer::buffer_writer(&local_b8,&local_f8);
  local_88._vptr_lazy_ostream =
       (_func_int **)CONCAT35(local_88._vptr_lazy_ostream._5_3_,0x8100000000);
  local_88._vptr_lazy_ostream = (_func_int **)CONCAT44(local_88._vptr_lazy_ostream._4_4_,0x15);
  ::operator<<(&local_b8,(message_header *)&local_88);
  lVar1 = 0;
  do {
    buffer_writer::operator<<(&local_b8,*(uint8_t *)((long)local_d8 + lVar1));
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  buffer_reader::buffer_reader(&local_68,&local_f8);
  ::operator>>(&local_68,&local_98);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1b2d70,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x184984);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xa0;
  local_a8.m_lhs.m_value = &local_98.right_speed;
  local_a8.m_rhs = local_d8 + 1;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<double_&>,_double_&,_boost::test_tools::assertion::op::EQ<double,_double,_void>_>
  ::evaluate(&local_110,&local_a8,false);
  local_c8 = "read_msg.right_speed == write_msg.right_speed";
  local_c0 = "";
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ae7e8;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_40.m_end = "";
  local_70 = &local_c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_110,&local_88,&local_40,0xa0,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_110.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1b2d70,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x184984);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xa1;
  local_a8.m_rhs = local_d8;
  local_a8.m_lhs.m_value = &local_98.left_speed;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<double_&>,_double_&,_boost::test_tools::assertion::op::EQ<double,_double,_void>_>
  ::evaluate(&local_110,&local_a8,false);
  local_c8 = "read_msg.left_speed == write_msg.left_speed";
  local_c0 = "";
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ae7e8;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_50.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_50.m_end = "";
  local_70 = &local_c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_110,&local_88,&local_50,0xa1,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_110.m_message.pn);
  if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(webots_velocity_message_write_read)
{
    webots_velocity_message write_msg;
    write_msg.right_speed = 2.5;
    write_msg.left_speed = 4.1;

    buffer buffer;
    buffer_writer writer(buffer);
    writer << write_msg;

    webots_velocity_message read_msg;
    buffer_reader reader(buffer);
    reader >> read_msg;

    BOOST_TEST(read_msg.right_speed == write_msg.right_speed);
    BOOST_TEST(read_msg.left_speed == write_msg.left_speed);
}